

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ConstantValue::convertToByteQueue(ConstantValue *this,bool isSigned)

{
  bool bVar1;
  undefined1 uVar2;
  SVQueue *in_RDI;
  char ch;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  SVQueue queue;
  string result;
  string *in_stack_fffffffffffffeb8;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  SVQueue *this_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  ConstantValue *in_stack_ffffffffffffff38;
  
  this_00 = in_RDI;
  bVar1 = isQueue((ConstantValue *)0x28c081);
  if (bVar1) {
    ConstantValue((ConstantValue *)
                  CONCAT17(in_stack_fffffffffffffec7,
                           CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                  (ConstantValue *)in_stack_fffffffffffffeb8);
    return (ConstantValue *)this_00;
  }
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  uVar2 = isInteger((ConstantValue *)0x28c0b2);
  if ((bool)uVar2) {
    convertToStr(in_stack_ffffffffffffff38);
    str_abi_cxx11_((ConstantValue *)in_RDI);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
    ~ConstantValue((ConstantValue *)0x28c11f);
  }
  else {
    in_stack_fffffffffffffec6 = isString((ConstantValue *)0x28c16d);
    if (!(bool)in_stack_fffffffffffffec6) {
      ConstantValue((ConstantValue *)
                    CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                    in_stack_fffffffffffffeb8);
      goto LAB_0028c2d8;
    }
    in_stack_fffffffffffffeb8 = str_abi_cxx11_((ConstantValue *)0x28c187);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
               in_stack_fffffffffffffeb8);
  }
  SVQueue::SVQueue((SVQueue *)
                   CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
  local_100._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin(in_stack_fffffffffffffeb8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  while (bVar1 = __gnu_cxx::
                 operator==<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffec6,
                                                       in_stack_fffffffffffffec0)),
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_fffffffffffffeb8), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&local_100);
    SVInt::SVInt((SVInt *)this_00,(bitwidth_t)((ulong)in_RDI >> 0x20),
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
                 SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
    std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
    emplace_back<slang::SVInt>
              ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
               CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)),
               (SVInt *)in_stack_fffffffffffffeb8);
    SVInt::~SVInt((SVInt *)this_00);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_100);
  }
  ConstantValue((ConstantValue *)this_00,in_RDI);
  SVQueue::~SVQueue((SVQueue *)0x28c2ca);
LAB_0028c2d8:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
  return (ConstantValue *)this_00;
}

Assistant:

ConstantValue ConstantValue::convertToByteQueue(bool isSigned) const {
    if (isQueue())
        return *this;

    std::string result;
    if (isInteger())
        result = convertToStr().str();
    else if (isString())
        result = str();
    else
        return nullptr;

    SVQueue queue;
    for (auto ch : result)
        queue.emplace_back(SVInt(8, static_cast<uint64_t>(ch), isSigned));

    return queue;
}